

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_tree_parse_children(mpack_tree_parser_t *parser,mpack_node_data_t *node)

{
  _Bool _Var1;
  mpack_tree_page_t *local_30;
  mpack_tree_page_t *page;
  size_t total;
  mpack_type_t type;
  mpack_node_data_t *node_local;
  mpack_tree_parser_t *parser_local;
  
  page = (mpack_tree_page_t *)(ulong)node->len;
  if (node->type == mpack_type_map) {
    page = (mpack_tree_page_t *)((long)page << 1);
  }
  _Var1 = mpack_tree_reserve_bytes(parser,(size_t)page);
  if (_Var1) {
    if ((mpack_tree_page_t *)parser->nodes_left < page) {
      if (parser->tree->next == (mpack_tree_page_t *)0x0) {
        mpack_tree_flag_error(parser->tree,mpack_error_too_big);
        return;
      }
      if ((page < (mpack_tree_page_t *)0x100) && (parser->nodes_left < 0x20)) {
        local_30 = (mpack_tree_page_t *)malloc(0xff8);
        if (local_30 == (mpack_tree_page_t *)0x0) {
          mpack_tree_flag_error(parser->tree,mpack_error_memory);
          return;
        }
        (node->value).children = local_30->nodes;
        parser->nodes = local_30->nodes + (long)page;
        parser->nodes_left = 0xff - (long)page;
      }
      else {
        local_30 = (mpack_tree_page_t *)
                   malloc((long)((long)&page[-1].nodes[0].value + 7) * 0x10 + 0x18);
        if (local_30 == (mpack_tree_page_t *)0x0) {
          mpack_tree_flag_error(parser->tree,mpack_error_memory);
          return;
        }
        (node->value).children = local_30->nodes;
      }
      local_30->next = parser->tree->next;
      parser->tree->next = local_30;
    }
    else {
      node->value = (anon_union_8_7_c87e5bf0_for_value)parser->nodes;
      parser->nodes = parser->nodes + (long)page;
      parser->nodes_left = parser->nodes_left - (long)page;
    }
    mpack_tree_push_stack(parser,(node->value).children,(size_t)page);
  }
  return;
}

Assistant:

static void mpack_tree_parse_children(mpack_tree_parser_t* parser, mpack_node_data_t* node) {
    mpack_type_t type = node->type;
    size_t total = node->len;

    // Calculate total elements to read
    if (type == mpack_type_map) {
        if ((uint64_t)total * 2 > (uint64_t)SIZE_MAX) {
            mpack_tree_flag_error(parser->tree, mpack_error_too_big);
            return;
        }
        total *= 2;
    }

    // Each node is at least one byte. Count these bytes now to make
    // sure there is enough data left.
    if (!mpack_tree_reserve_bytes(parser, total))
        return;

    // If there are enough nodes left in the current page, no need to grow
    if (total <= parser->nodes_left) {
        node->value.children = parser->nodes;
        parser->nodes += total;
        parser->nodes_left -= total;

    } else {

        #ifdef MPACK_MALLOC

        // We can't grow if we're using a fixed pool (i.e. we didn't start with a page)
        if (!parser->tree->next) {
            mpack_tree_flag_error(parser->tree, mpack_error_too_big);
            return;
        }

        // Otherwise we need to grow, and the node's children need to be contiguous.
        // This is a heuristic to decide whether we should waste the remaining space
        // in the current page and start a new one, or give the children their
        // own page. With a fraction of 1/8, this causes at most 12% additional
        // waste. Note that reducing this too much causes less cache coherence and
        // more malloc() overhead due to smaller allocations, so there's a tradeoff
        // here. This heuristic could use some improvement, especially with custom
        // page sizes.

        mpack_tree_page_t* page;

        if (total > MPACK_NODES_PER_PAGE || parser->nodes_left > MPACK_NODES_PER_PAGE / 8) {
            page = (mpack_tree_page_t*)MPACK_MALLOC(
                    sizeof(mpack_tree_page_t) + sizeof(mpack_node_data_t) * (total - 1));
            if (page == NULL) {
                mpack_tree_flag_error(parser->tree, mpack_error_memory);
                return;
            }
            mpack_log("allocated seperate page %p for %i children, %i left in page of %i total\n",
                    page, (int)total, (int)parser->nodes_left, (int)MPACK_NODES_PER_PAGE);

            node->value.children = page->nodes;

        } else {
            page = (mpack_tree_page_t*)MPACK_MALLOC(MPACK_PAGE_ALLOC_SIZE);
            if (page == NULL) {
                mpack_tree_flag_error(parser->tree, mpack_error_memory);
                return;
            }
            mpack_log("allocated new page %p for %i children, wasting %i in page of %i total\n",
                    page, (int)total, (int)parser->nodes_left, (int)MPACK_NODES_PER_PAGE);

            node->value.children = page->nodes;
            parser->nodes = page->nodes + total;
            parser->nodes_left = MPACK_NODES_PER_PAGE - total;
        }

        page->next = parser->tree->next;
        parser->tree->next = page;

        #else
        // We can't grow if we don't have an allocator
        mpack_tree_flag_error(parser->tree, mpack_error_too_big);
        return;
        #endif
    }

    mpack_tree_push_stack(parser, node->value.children, total);
}